

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O1

void __thiscall
csv::internals::MmapParser::MmapParser
          (MmapParser *this,string_view filename,CSVFormat *format,ColNamesPtr *col_names)

{
  size_t sVar1;
  char *__s;
  char *extraout_RDX;
  string_view filename_00;
  
  __s = filename._M_str;
  IBasicCSVParser::IBasicCSVParser(&this->super_IBasicCSVParser,format,col_names);
  (this->super_IBasicCSVParser)._vptr_IBasicCSVParser = (_func_int **)&PTR__MmapParser_00118cc0;
  (this->_filename)._M_dataplus._M_p = (pointer)&(this->_filename).field_2;
  (this->_filename)._M_string_length = 0;
  (this->_filename).field_2._M_local_buf[0] = '\0';
  this->mmap_pos = 0;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->_filename,0,(char *)0x0,(ulong)__s);
  filename_00._M_str = extraout_RDX;
  filename_00._M_len = (size_t)__s;
  sVar1 = get_file_size((internals *)filename._M_len,filename_00);
  (this->super_IBasicCSVParser).source_size = sVar1;
  return;
}

Assistant:

MmapParser(csv::string_view filename,
                const CSVFormat& format,
                const ColNamesPtr& col_names = nullptr
            ) : IBasicCSVParser(format, col_names) {
                this->_filename = filename.data();
                this->source_size = get_file_size(filename);
            }